

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationFormatter.cxx
# Opt level: O1

void __thiscall
cmDocumentationFormatter::PrintFormatted(cmDocumentationFormatter *this,ostream *os,char *text)

{
  char *pcVar1;
  char cVar2;
  string preformatted;
  string paragraph;
  undefined1 *local_70;
  ulong local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  undefined1 *local_50;
  ulong local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  if ((text != (char *)0x0) && (*text != '\0')) {
    do {
      local_70 = &local_60;
      local_68 = 0;
      local_60 = 0;
      while (cVar2 = *text, cVar2 == ' ') {
        while ((cVar2 != '\n' && (cVar2 != '\0'))) {
          std::__cxx11::string::_M_replace_aux((ulong)&local_70,local_68,0,'\x01');
          pcVar1 = text + 1;
          text = text + 1;
          cVar2 = *pcVar1;
        }
        if (*text != '\0') {
          std::__cxx11::string::_M_replace_aux((ulong)&local_70,local_68,0,'\x01');
          text = text + 1;
        }
      }
      if (local_68 != 0) {
        (*this->_vptr_cmDocumentationFormatter[3])(this,os,local_70);
      }
      local_48 = 0;
      local_40 = 0;
      local_50 = &local_40;
      for (; *text != '\0'; text = text + 1) {
        if (*text == '\n') {
          std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_48,0,'\x01');
          text = text + 1;
          break;
        }
        std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_48,0,'\x01');
      }
      if (local_48 != 0) {
        (*this->_vptr_cmDocumentationFormatter[4])(this,os,local_50);
      }
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
      }
    } while (*text != '\0');
  }
  return;
}

Assistant:

void cmDocumentationFormatter::PrintFormatted(std::ostream& os,
                                              const char* text)
{
  if(!text)
    {
    return;
    }
  const char* ptr = text;
  while(*ptr)
    {
    // Any ptrs starting in a space are treated as preformatted text.
    std::string preformatted;
    while(*ptr == ' ')
      {
      for(char ch = *ptr; ch && ch != '\n'; ++ptr, ch = *ptr)
        {
        preformatted.append(1, ch);
        }
      if(*ptr)
        {
        ++ptr;
        preformatted.append(1, '\n');
        }
      }
    if(!preformatted.empty())
      {
      this->PrintPreformatted(os, preformatted.c_str());
      }

    // Other ptrs are treated as paragraphs.
    std::string paragraph;
    for(char ch = *ptr; ch && ch != '\n'; ++ptr, ch = *ptr)
      {
      paragraph.append(1, ch);
      }
    if(*ptr)
      {
      ++ptr;
      paragraph.append(1, '\n');
      }
    if(!paragraph.empty())
      {
      this->PrintParagraph(os, paragraph.c_str());
      }
    }
}